

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

ggml_tensor * __thiscall llm_graph_context::build_inp_pos_bucket_dec(llm_graph_context *this)

{
  ggml_tensor *pgVar1;
  llm_graph_input_i *plVar2;
  _func_int **pp_Var3;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_30;
  llm_graph_input_i *local_28;
  llama_kv_cache_unified *kv_self;
  
  kv_self = (llama_kv_cache_unified *)this->memory;
  std::
  make_unique<llm_graph_input_pos_bucket_kv,llama_hparams_const&,llama_kv_cache_unified_const*&>
            ((llama_hparams *)&local_28,(llama_kv_cache_unified **)this->hparams);
  plVar2 = local_28;
  pp_Var3 = (_func_int **)ggml_new_tensor_2d(this->ctx0,0x1a,kv_self->n,(long)this->n_tokens);
  plVar2[1]._vptr_llm_graph_input_i = pp_Var3;
  ggml_set_input(pp_Var3);
  local_30._M_head_impl = local_28;
  local_28 = (llm_graph_input_i *)0x0;
  llm_graph_result::add_input
            ((this->res)._M_t.
             super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
             super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
             super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
             (llm_graph_input_ptr *)&local_30);
  if (local_30._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_30._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  local_30._M_head_impl = (llm_graph_input_i *)0x0;
  pgVar1 = (ggml_tensor *)plVar2[1]._vptr_llm_graph_input_i;
  if (local_28 != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return pgVar1;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_pos_bucket_dec() const {
    const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

    auto inp = std::make_unique<llm_graph_input_pos_bucket_kv>(hparams, kv_self);

    const auto n_kv = kv_self->n;

    auto & cur = inp->pos_bucket;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_I32, n_kv, n_tokens);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}